

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O1

void __thiscall
wasm::OptimizationOptions::OptimizationOptions
          (OptimizationOptions *this,string *command,string *description)

{
  pointer pcVar1;
  string *psVar2;
  long *plVar3;
  undefined8 uVar4;
  long *plVar5;
  size_type *psVar6;
  pointer pbVar7;
  OptimizationOptions *local_ef8;
  undefined8 uStack_ef0;
  code *local_ee8;
  code *pcStack_ee0;
  OptimizationOptions *local_ed8;
  undefined8 uStack_ed0;
  code *local_ec8;
  code *pcStack_ec0;
  OptimizationOptions *local_eb8;
  undefined8 uStack_eb0;
  code *local_ea8;
  code *pcStack_ea0;
  OptimizationOptions *local_e98;
  undefined8 uStack_e90;
  code *local_e88;
  code *pcStack_e80;
  OptimizationOptions *local_e78;
  undefined8 uStack_e70;
  code *local_e68;
  code *pcStack_e60;
  OptimizationOptions *local_e58;
  undefined8 uStack_e50;
  code *local_e48;
  code *pcStack_e40;
  OptimizationOptions *local_e38;
  undefined8 uStack_e30;
  code *local_e28;
  code *pcStack_e20;
  OptimizationOptions *local_e18;
  undefined8 uStack_e10;
  code *local_e08;
  code *pcStack_e00;
  OptimizationOptions *local_df8;
  undefined8 uStack_df0;
  code *local_de8;
  code *pcStack_de0;
  OptimizationOptions *local_dd8;
  undefined8 uStack_dd0;
  code *local_dc8;
  code *pcStack_dc0;
  OptimizationOptions *local_db8;
  undefined8 uStack_db0;
  code *local_da8;
  code *pcStack_da0;
  OptimizationOptions *local_d98;
  undefined8 uStack_d90;
  code *local_d88;
  code *pcStack_d80;
  OptimizationOptions *local_d78;
  undefined8 uStack_d70;
  code *local_d68;
  code *pcStack_d60;
  OptimizationOptions *local_d58;
  undefined8 uStack_d50;
  code *local_d48;
  code *pcStack_d40;
  OptimizationOptions *local_d38;
  undefined8 uStack_d30;
  code *local_d28;
  code *pcStack_d20;
  OptimizationOptions *local_d18;
  undefined8 uStack_d10;
  code *local_d08;
  code *pcStack_d00;
  OptimizationOptions *local_cf8;
  undefined8 uStack_cf0;
  code *local_ce8;
  code *pcStack_ce0;
  OptimizationOptions *local_cd8;
  undefined8 uStack_cd0;
  code *local_cc8;
  code *pcStack_cc0;
  OptimizationOptions *local_cb8;
  undefined8 uStack_cb0;
  code *local_ca8;
  code *pcStack_ca0;
  OptimizationOptions *local_c98;
  undefined8 uStack_c90;
  code *local_c88;
  code *pcStack_c80;
  OptimizationOptions *local_c78;
  undefined8 uStack_c70;
  code *local_c68;
  code *pcStack_c60;
  long *local_c50 [2];
  long local_c40 [2];
  long *local_c30 [2];
  long local_c20 [2];
  long *local_c10 [2];
  long local_c00 [2];
  long *local_bf0 [2];
  long local_be0 [2];
  pointer local_bd0;
  long *local_bc8 [2];
  long local_bb8 [2];
  long *local_ba8 [2];
  long local_b98 [2];
  long *local_b88 [2];
  long local_b78 [2];
  long *local_b68 [2];
  long local_b58 [2];
  long *local_b48 [2];
  long local_b38 [2];
  long *local_b28 [2];
  long local_b18 [2];
  long *local_b08 [2];
  long local_af8 [2];
  long *local_ae8 [2];
  long local_ad8 [2];
  long *local_ac8 [2];
  long local_ab8 [2];
  long *local_aa8 [2];
  long local_a98 [2];
  long *local_a88 [2];
  long local_a78 [2];
  long *local_a68 [2];
  long local_a58 [2];
  long *local_a48 [2];
  long local_a38 [2];
  long *local_a28 [2];
  long local_a18 [2];
  long *local_a08 [2];
  long local_9f8 [2];
  long *local_9e8 [2];
  long local_9d8 [2];
  long *local_9c8 [2];
  long local_9b8 [2];
  long *local_9a8 [2];
  long local_998 [2];
  long *local_988 [2];
  long local_978 [2];
  long *local_968 [2];
  long local_958 [2];
  long *local_948 [2];
  long local_938 [2];
  long *local_928 [2];
  long local_918 [2];
  long *local_908 [2];
  long local_8f8 [2];
  long *local_8e8 [2];
  long local_8d8 [2];
  long *local_8c8 [2];
  long local_8b8 [2];
  long *local_8a8 [2];
  long local_898 [2];
  long *local_888 [2];
  long local_878 [2];
  long *local_868 [2];
  long local_858 [2];
  long *local_848 [2];
  long local_838 [2];
  long *local_828 [2];
  long local_818 [2];
  long *local_808 [2];
  long local_7f8 [2];
  long *local_7e8 [2];
  long local_7d8 [2];
  long *local_7c8 [2];
  long local_7b8 [2];
  long *local_7a8 [2];
  long local_798 [2];
  long *local_788 [2];
  long local_778 [2];
  long *local_768 [2];
  long local_758 [2];
  long *local_748 [2];
  long local_738 [2];
  long *local_728 [2];
  long local_718 [2];
  long *local_708 [2];
  long local_6f8 [2];
  size_type *local_6e8;
  string __str;
  long local_6b8 [2];
  long *local_6a8 [2];
  long local_698 [2];
  long *local_688 [2];
  long local_678 [2];
  size_type *local_668;
  string __str_1;
  long local_638 [2];
  long *local_628 [2];
  long local_618 [2];
  long *local_608 [2];
  long local_5f8 [2];
  long *local_5e8 [2];
  long local_5d8 [2];
  long *local_5c8 [2];
  long local_5b8 [2];
  long *local_5a8 [2];
  long local_598 [2];
  long *local_588 [2];
  long local_578 [2];
  long *local_568 [2];
  long local_558 [2];
  long *local_548 [2];
  long local_538 [2];
  long *local_528 [2];
  long local_518 [2];
  long *local_508 [2];
  long local_4f8 [2];
  size_type *local_4e8;
  string __str_2;
  long local_4b8 [2];
  long *local_4a8 [2];
  long local_498 [2];
  long *local_488 [2];
  long local_478 [2];
  long *local_468 [2];
  long local_458 [2];
  long *local_448 [2];
  long local_438 [2];
  long *local_428 [2];
  long local_418 [2];
  long *local_408 [2];
  long local_3f8 [2];
  long *local_3e8 [2];
  long local_3d8 [2];
  long *local_3c8 [2];
  long local_3b8 [2];
  long *local_3a8 [2];
  long local_398 [2];
  long *local_388 [2];
  long local_378 [2];
  long *local_368 [2];
  long local_358 [2];
  long *local_348 [2];
  long local_338 [2];
  long *local_328 [2];
  long local_318 [2];
  long *local_308 [2];
  long local_2f8 [2];
  long *local_2e8 [2];
  long local_2d8 [2];
  long *local_2c8 [2];
  long local_2b8 [2];
  long *local_2a8 [2];
  long local_298 [2];
  long *local_288 [2];
  long local_278 [2];
  long *local_268 [2];
  long local_258 [2];
  long *local_248 [2];
  long local_238 [2];
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8;
  ulong local_1c0;
  long local_1b8;
  long lStack_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  long *local_188;
  long local_180;
  long local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  long *local_168;
  long local_160;
  long local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  OptimizationOptions *local_148;
  undefined8 uStack_140;
  code *local_138;
  code *pcStack_130;
  undefined1 local_120 [32];
  code **local_100 [2];
  code *local_f0 [2];
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  undefined1 local_d0 [24];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  size_type *local_58;
  __node_base local_50;
  size_type local_48;
  float fStack_40;
  undefined4 uStack_3c;
  OptimizationOptions *local_38;
  
  ToolOptions::ToolOptions(&this->super_ToolOptions,command,description);
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->passes).
  super__Vector_base<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = (undefined1  [8])local_d0;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"");
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"-O","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"execute default optimization passes (equivalent to -Os)","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Optimization options","");
  uStack_140 = 0;
  local_148 = local_38;
  pcStack_130 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:77:9)>
                ::_M_invoke;
  local_138 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:77:9)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     ((string *)local_38,(string *)local_e0,(string *)&local_58,(string *)local_b8,
                      (Arguments)local_98,(function *)0x0,SUB81(&local_148,0));
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"-O0","");
  local_120._0_8_ = local_120 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_120,"execute no optimization passes","");
  local_bc8[0] = local_bb8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bc8,"Optimization options","");
  uStack_ef0 = 0;
  local_ef8 = local_38;
  pcStack_ee0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:90:12)>
                ::_M_invoke;
  local_ee8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:90:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_78,(string *)local_100,(string *)local_120,
                      (Arguments)local_bc8,(function *)0x0,SUB81(&local_ef8,0));
  local_ba8[0] = local_b98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ba8,"");
  local_b88[0] = local_b78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b88,"-O1","");
  local_b68[0] = local_b58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b68,
             "execute -O1 optimization passes (quick&useful opts, useful for iteration builds)","");
  local_b48[0] = local_b38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b48,"Optimization options","");
  uStack_ed0 = 0;
  local_ed8 = local_38;
  pcStack_ec0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:100:12)>
                ::_M_invoke;
  local_ec8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:100:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_ba8,(string *)local_b88,(string *)local_b68,
                      (Arguments)local_b48,(function *)0x0,SUB81(&local_ed8,0));
  local_b28[0] = local_b18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"");
  local_b08[0] = local_af8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b08,"-O2","");
  local_ae8[0] = local_ad8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ae8,
             "execute -O2 optimization passes (most opts, generally gets most perf)","");
  local_ac8[0] = local_ab8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac8,"Optimization options","");
  uStack_eb0 = 0;
  local_eb8 = local_38;
  pcStack_ea0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:111:9)>
                ::_M_invoke;
  local_ea8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:111:9)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_b28,(string *)local_b08,(string *)local_ae8,
                      (Arguments)local_ac8,(function *)0x0,SUB81(&local_eb8,0));
  local_aa8[0] = local_a98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_aa8,"");
  local_a88[0] = local_a78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a88,"-O3","");
  local_a68[0] = local_a58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a68,
             "execute -O3 optimization passes (spends potentially a lot of time optimizing)","");
  local_a48[0] = local_a38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a48,"Optimization options","");
  uStack_e90 = 0;
  local_e98 = local_38;
  pcStack_e80 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:122:12)>
                ::_M_invoke;
  local_e88 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:122:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_aa8,(string *)local_a88,(string *)local_a68,
                      (Arguments)local_a48,(function *)0x0,SUB81(&local_e98,0));
  local_a28[0] = local_a18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a28,"");
  local_a08[0] = local_9f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a08,"-O4","");
  local_9e8[0] = local_9d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9e8,
             "execute -O4 optimization passes (also flatten the IR, which can take a lot more time and memory, but is useful on more nested / complex / less-optimized input)"
             ,"");
  local_9c8[0] = local_9b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9c8,"Optimization options","");
  uStack_e70 = 0;
  local_e78 = local_38;
  pcStack_e60 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:134:12)>
                ::_M_invoke;
  local_e68 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:134:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_a28,(string *)local_a08,(string *)local_9e8,
                      (Arguments)local_9c8,(function *)0x0,SUB81(&local_e78,0));
  local_9a8[0] = local_998;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9a8,"");
  local_988[0] = local_978;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_988,"-Os","");
  local_968[0] = local_958;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_968,"execute default optimization passes, focusing on code size","");
  local_948[0] = local_938;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"Optimization options","");
  uStack_e50 = 0;
  local_e58 = local_38;
  pcStack_e40 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:144:12)>
                ::_M_invoke;
  local_e48 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:144:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_9a8,(string *)local_988,(string *)local_968,
                      (Arguments)local_948,(function *)0x0,SUB81(&local_e58,0));
  local_928[0] = local_918;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_928,"");
  local_908[0] = local_8f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"-Oz","");
  local_8e8[0] = local_8d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8e8,"execute default optimization passes, super-focusing on code size",
             "");
  local_8c8[0] = local_8b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"Optimization options","");
  uStack_e30 = 0;
  local_e38 = local_38;
  pcStack_e20 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:154:12)>
                ::_M_invoke;
  local_e28 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:154:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_928,(string *)local_908,(string *)local_8e8,
                      (Arguments)local_8c8,(function *)0x0,SUB81(&local_e38,0));
  local_8a8[0] = local_898;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"--optimize-level","");
  local_888[0] = local_878;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_888,"-ol","");
  local_868[0] = local_858;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_868,"How much to focus on optimizing code","");
  local_848[0] = local_838;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Optimization options","");
  uStack_e10 = 0;
  local_e18 = local_38;
  pcStack_e00 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:164:12)>
                ::_M_invoke;
  local_e08 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:164:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_8a8,(string *)local_888,(string *)local_868,
                      (Arguments)local_848,(function *)0x1,SUB81(&local_e18,0));
  local_828[0] = local_818;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_828,"--shrink-level","");
  local_808[0] = local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"-s","");
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,"How much to focus on shrinking code size","");
  local_7c8[0] = local_7b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7c8,"Optimization options","");
  uStack_df0 = 0;
  local_df8 = local_38;
  pcStack_de0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:172:12)>
                ::_M_invoke;
  local_de8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:172:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_828,(string *)local_808,(string *)local_7e8,
                      (Arguments)local_7c8,(function *)0x1,SUB81(&local_df8,0));
  local_7a8[0] = local_798;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"--debuginfo","");
  local_788[0] = local_778;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_788,"-g","");
  local_768[0] = local_758;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_768,"Emit names section in wasm binary (or full debuginfo in wast)","")
  ;
  local_748[0] = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_748,"Optimization options","");
  uStack_dd0 = 0;
  local_dd8 = local_38;
  pcStack_dc0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:180:12)>
                ::_M_invoke;
  local_dc8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:180:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_7a8,(string *)local_788,(string *)local_768,
                      (Arguments)local_748,(function *)0x0,SUB81(&local_dd8,0));
  local_728[0] = local_718;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_728,"--always-inline-max-function-size","");
  local_708[0] = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_708,"-aimfs","");
  local_6e8 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_6e8,'\x01');
  *(undefined1 *)local_6e8 = 0x32;
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_6e8,0,(char *)0x0,0x1a54e6);
  local_1e8 = &local_1d8;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_1d8 = *plVar5;
    lStack_1d0 = plVar3[3];
  }
  else {
    local_1d8 = *plVar5;
    local_1e8 = (long *)*plVar3;
  }
  local_1e0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e8);
  local_1a8 = &local_198;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_198 = *plVar5;
    uStack_190 = (undefined4)plVar3[3];
    uStack_18c = *(undefined4 *)((long)plVar3 + 0x1c);
  }
  else {
    local_198 = *plVar5;
    local_1a8 = (long *)*plVar3;
  }
  local_1a0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  __str.field_2._8_8_ = local_6b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str.field_2 + 8),"Optimization options","");
  uStack_db0 = 0;
  local_db8 = local_38;
  pcStack_da0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:191:12)>
                ::_M_invoke;
  local_da8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:191:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_728,(string *)local_708,(string *)&local_1a8,
                      (int)&__str + 0x18,(function *)0x1,SUB81(&local_db8,0));
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6a8,"--flexible-inline-max-function-size","");
  local_688[0] = local_678;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"-fimfs","");
  local_668 = &__str_1._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_668,'\x02');
  *(undefined2 *)local_668 = 0x3032;
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_668,0,(char *)0x0,0x1a5572);
  local_188 = &local_178;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_178 = *plVar5;
    uStack_170 = (undefined4)plVar3[3];
    uStack_16c = *(undefined4 *)((long)plVar3 + 0x1c);
  }
  else {
    local_178 = *plVar5;
    local_188 = (long *)*plVar3;
  }
  local_180 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  __str_1.field_2._8_8_ = local_638;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_1.field_2 + 8),"Optimization options","");
  uStack_d90 = 0;
  local_d98 = local_38;
  pcStack_d80 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:203:12)>
                ::_M_invoke;
  local_d88 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:203:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_6a8,(string *)local_688,(string *)&local_188,
                      (int)&__str_1 + 0x18,(function *)0x1,SUB81(&local_d98,0));
  local_628[0] = local_618;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_628,"--one-caller-inline-max-function-size","");
  local_608[0] = local_5f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_608,"-ocimfs","");
  local_5e8[0] = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5e8,
             "Max size of functions that are inlined when there is only one caller (default -1, which means all such functions are inlined)"
             ,"");
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"Optimization options","");
  uStack_d70 = 0;
  local_d78 = local_38;
  pcStack_d60 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:213:12)>
                ::_M_invoke;
  local_d68 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:213:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_628,(string *)local_608,(string *)local_5e8,
                      (Arguments)local_5c8,(function *)0x1,SUB81(&local_d78,0));
  local_5a8[0] = local_598;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5a8,"--inline-functions-with-loops","");
  local_588[0] = local_578;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"-ifwl","");
  local_568[0] = local_558;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_568,"Allow inlining functions with loops","");
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"Optimization options","");
  uStack_d50 = 0;
  local_d58 = local_38;
  pcStack_d40 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:225:12)>
                ::_M_invoke;
  local_d48 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:225:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_5a8,(string *)local_588,(string *)local_568,
                      (Arguments)local_548,(function *)0x0,SUB81(&local_d58,0));
  local_528[0] = local_518;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_528,"--partial-inlining-ifs","");
  local_508[0] = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"-pii","");
  local_4e8 = &__str_2._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_4e8,'\x01');
  *(undefined1 *)local_4e8 = 0x30;
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_4e8,0,(char *)0x0,0x1a570f);
  local_1c8 = &local_1b8;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_1b8 = *plVar5;
    lStack_1b0 = plVar3[3];
  }
  else {
    local_1b8 = *plVar5;
    local_1c8 = (long *)*plVar3;
  }
  local_1c0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_1c8,local_1c0,0,'\x01');
  local_168 = &local_158;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_158 = *plVar5;
    uStack_150 = (undefined4)plVar3[3];
    uStack_14c = *(undefined4 *)((long)plVar3 + 0x1c);
  }
  else {
    local_158 = *plVar5;
    local_168 = (long *)*plVar3;
  }
  local_160 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  __str_2.field_2._8_8_ = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&__str_2.field_2 + 8),"Optimization options","");
  uStack_d30 = 0;
  local_d38 = local_38;
  pcStack_d20 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:235:12)>
                ::_M_invoke;
  local_d28 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:235:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_528,(string *)local_508,(string *)&local_168,
                      (int)&__str_2 + 0x18,(function *)0x1,SUB81(&local_d38,0));
  local_4a8[0] = local_498;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"--ignore-implicit-traps","");
  local_488[0] = local_478;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"-iit","");
  local_468[0] = local_458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,
             "Optimize under the helpful assumption that no surprising traps occur (from load, div/mod, etc.)"
             ,"");
  local_448[0] = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"Optimization options","");
  uStack_d10 = 0;
  local_d18 = local_38;
  pcStack_d00 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:245:12)>
                ::_M_invoke;
  local_d08 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:245:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_4a8,(string *)local_488,(string *)local_468,
                      (Arguments)local_448,(function *)0x0,SUB81(&local_d18,0));
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"--traps-never-happen","");
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"-tnh","");
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e8,
             "Optimize under the helpful assumption that no trap is reached at runtime (from load, div/mod, etc.)"
             ,"");
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"Optimization options","");
  uStack_cf0 = 0;
  local_cf8 = local_38;
  pcStack_ce0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:254:12)>
                ::_M_invoke;
  local_ce8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:254:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_428,(string *)local_408,(string *)local_3e8,
                      (Arguments)local_3c8,(function *)0x0,SUB81(&local_cf8,0));
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"--low-memory-unused","");
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"-lmu","");
  local_368[0] = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_368,
             "Optimize under the helpful assumption that the low 1K of memory is not used by the application"
             ,"");
  local_348[0] = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_348,"Optimization options","");
  uStack_cd0 = 0;
  local_cd8 = local_38;
  pcStack_cc0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:263:12)>
                ::_M_invoke;
  local_cc8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:263:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_3a8,(string *)local_388,(string *)local_368,
                      (Arguments)local_348,(function *)0x0,SUB81(&local_cd8,0));
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"--fast-math","");
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"-ffm","");
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e8,
             "Optimize floats without handling corner cases of NaNs and rounding","");
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"Optimization options","");
  uStack_cb0 = 0;
  local_cb8 = local_38;
  pcStack_ca0 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:272:9)>
                ::_M_invoke;
  local_ca8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:272:9)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_328,(string *)local_308,(string *)local_2e8,
                      (Arguments)local_2c8,(function *)0x0,SUB81(&local_cb8,0));
  local_c50[0] = local_c40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c50,"--zero-filled-memory","");
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"-uim","");
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,"Assume that an imported memory will be zero-initialized","");
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"Optimization options","");
  uStack_c90 = 0;
  local_c98 = local_38;
  pcStack_c80 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:278:12)>
                ::_M_invoke;
  local_c88 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:278:12)>
              ::_M_manager;
  psVar2 = (string *)
           ::wasm::Options::add
                     (psVar2,(string *)local_c50,(string *)local_2a8,(string *)local_288,
                      (Arguments)local_268,(function *)0x0,SUB81(&local_c98,0));
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"--skip-pass","");
  local_c30[0] = local_c20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c30,"-sp","");
  local_c10[0] = local_c00;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c10,"Skip a pass (do not run it)","");
  local_bf0[0] = local_be0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_bf0,"Optimization options","");
  uStack_c70 = 0;
  local_c78 = local_38;
  pcStack_c60 = std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:286:12)>
                ::_M_invoke;
  local_c68 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/optimization-options.h:286:12)>
              ::_M_manager;
  ::wasm::Options::add
            (psVar2,(string *)local_248,(string *)local_c30,(string *)local_c10,(Arguments)local_bf0
             ,(function *)0x1,SUB81(&local_c78,0));
  if (local_c68 != (code *)0x0) {
    (*local_c68)(&local_c78,&local_c78,3);
  }
  if (local_bf0[0] != local_be0) {
    operator_delete(local_bf0[0],local_be0[0] + 1);
  }
  if (local_c10[0] != local_c00) {
    operator_delete(local_c10[0],local_c00[0] + 1);
  }
  if (local_c30[0] != local_c20) {
    operator_delete(local_c30[0],local_c20[0] + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if (local_c88 != (code *)0x0) {
    (*local_c88)(&local_c98,&local_c98,3);
  }
  if (local_268[0] != local_258) {
    operator_delete(local_268[0],local_258[0] + 1);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0],local_298[0] + 1);
  }
  if (local_c50[0] != local_c40) {
    operator_delete(local_c50[0],local_c40[0] + 1);
  }
  if (local_ca8 != (code *)0x0) {
    (*local_ca8)(&local_cb8,&local_cb8,3);
  }
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0],local_2b8[0] + 1);
  }
  if (local_2e8[0] != local_2d8) {
    operator_delete(local_2e8[0],local_2d8[0] + 1);
  }
  if (local_308[0] != local_2f8) {
    operator_delete(local_308[0],local_2f8[0] + 1);
  }
  if (local_328[0] != local_318) {
    operator_delete(local_328[0],local_318[0] + 1);
  }
  if (local_cc8 != (code *)0x0) {
    (*local_cc8)(&local_cd8,&local_cd8,3);
  }
  if (local_348[0] != local_338) {
    operator_delete(local_348[0],local_338[0] + 1);
  }
  if (local_368[0] != local_358) {
    operator_delete(local_368[0],local_358[0] + 1);
  }
  if (local_388[0] != local_378) {
    operator_delete(local_388[0],local_378[0] + 1);
  }
  if (local_3a8[0] != local_398) {
    operator_delete(local_3a8[0],local_398[0] + 1);
  }
  if (local_ce8 != (code *)0x0) {
    (*local_ce8)(&local_cf8,&local_cf8,3);
  }
  if (local_3c8[0] != local_3b8) {
    operator_delete(local_3c8[0],local_3b8[0] + 1);
  }
  if (local_3e8[0] != local_3d8) {
    operator_delete(local_3e8[0],local_3d8[0] + 1);
  }
  if (local_408[0] != local_3f8) {
    operator_delete(local_408[0],local_3f8[0] + 1);
  }
  if (local_428[0] != local_418) {
    operator_delete(local_428[0],local_418[0] + 1);
  }
  if (local_d08 != (code *)0x0) {
    (*local_d08)(&local_d18,&local_d18,3);
  }
  if (local_448[0] != local_438) {
    operator_delete(local_448[0],local_438[0] + 1);
  }
  if (local_468[0] != local_458) {
    operator_delete(local_468[0],local_458[0] + 1);
  }
  if (local_488[0] != local_478) {
    operator_delete(local_488[0],local_478[0] + 1);
  }
  if (local_4a8[0] != local_498) {
    operator_delete(local_4a8[0],local_498[0] + 1);
  }
  if (local_d28 != (code *)0x0) {
    (*local_d28)(&local_d38,&local_d38,3);
  }
  if ((long *)__str_2.field_2._8_8_ != local_4b8) {
    operator_delete((void *)__str_2.field_2._8_8_,local_4b8[0] + 1);
  }
  if (local_168 != &local_158) {
    operator_delete(local_168,local_158 + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,local_1b8 + 1);
  }
  if (local_4e8 != &__str_2._M_string_length) {
    operator_delete(local_4e8,__str_2._M_string_length + 1);
  }
  if (local_508[0] != local_4f8) {
    operator_delete(local_508[0],local_4f8[0] + 1);
  }
  if (local_528[0] != local_518) {
    operator_delete(local_528[0],local_518[0] + 1);
  }
  if (local_d48 != (code *)0x0) {
    (*local_d48)(&local_d58,&local_d58,3);
  }
  if (local_548[0] != local_538) {
    operator_delete(local_548[0],local_538[0] + 1);
  }
  if (local_568[0] != local_558) {
    operator_delete(local_568[0],local_558[0] + 1);
  }
  if (local_588[0] != local_578) {
    operator_delete(local_588[0],local_578[0] + 1);
  }
  if (local_5a8[0] != local_598) {
    operator_delete(local_5a8[0],local_598[0] + 1);
  }
  if (local_d68 != (code *)0x0) {
    (*local_d68)(&local_d78,&local_d78,3);
  }
  if (local_5c8[0] != local_5b8) {
    operator_delete(local_5c8[0],local_5b8[0] + 1);
  }
  if (local_5e8[0] != local_5d8) {
    operator_delete(local_5e8[0],local_5d8[0] + 1);
  }
  if (local_608[0] != local_5f8) {
    operator_delete(local_608[0],local_5f8[0] + 1);
  }
  if (local_628[0] != local_618) {
    operator_delete(local_628[0],local_618[0] + 1);
  }
  if (local_d88 != (code *)0x0) {
    (*local_d88)(&local_d98,&local_d98,3);
  }
  if ((long *)__str_1.field_2._8_8_ != local_638) {
    operator_delete((void *)__str_1.field_2._8_8_,local_638[0] + 1);
  }
  if (local_188 != &local_178) {
    operator_delete(local_188,local_178 + 1);
  }
  if (local_668 != &__str_1._M_string_length) {
    operator_delete(local_668,__str_1._M_string_length + 1);
  }
  if (local_688[0] != local_678) {
    operator_delete(local_688[0],local_678[0] + 1);
  }
  if (local_6a8[0] != local_698) {
    operator_delete(local_6a8[0],local_698[0] + 1);
  }
  if (local_da8 != (code *)0x0) {
    (*local_da8)(&local_db8,&local_db8,3);
  }
  if ((long *)__str.field_2._8_8_ != local_6b8) {
    operator_delete((void *)__str.field_2._8_8_,local_6b8[0] + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,local_1d8 + 1);
  }
  if (local_6e8 != &__str._M_string_length) {
    operator_delete(local_6e8,__str._M_string_length + 1);
  }
  if (local_708[0] != local_6f8) {
    operator_delete(local_708[0],local_6f8[0] + 1);
  }
  if (local_728[0] != local_718) {
    operator_delete(local_728[0],local_718[0] + 1);
  }
  if (local_dc8 != (code *)0x0) {
    (*local_dc8)(&local_dd8,&local_dd8,3);
  }
  if (local_748[0] != local_738) {
    operator_delete(local_748[0],local_738[0] + 1);
  }
  if (local_768[0] != local_758) {
    operator_delete(local_768[0],local_758[0] + 1);
  }
  if (local_788[0] != local_778) {
    operator_delete(local_788[0],local_778[0] + 1);
  }
  if (local_7a8[0] != local_798) {
    operator_delete(local_7a8[0],local_798[0] + 1);
  }
  if (local_de8 != (code *)0x0) {
    (*local_de8)(&local_df8,&local_df8,3);
  }
  if (local_7c8[0] != local_7b8) {
    operator_delete(local_7c8[0],local_7b8[0] + 1);
  }
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0],local_7d8[0] + 1);
  }
  if (local_808[0] != local_7f8) {
    operator_delete(local_808[0],local_7f8[0] + 1);
  }
  if (local_828[0] != local_818) {
    operator_delete(local_828[0],local_818[0] + 1);
  }
  if (local_e08 != (code *)0x0) {
    (*local_e08)(&local_e18,&local_e18,3);
  }
  if (local_848[0] != local_838) {
    operator_delete(local_848[0],local_838[0] + 1);
  }
  if (local_868[0] != local_858) {
    operator_delete(local_868[0],local_858[0] + 1);
  }
  if (local_888[0] != local_878) {
    operator_delete(local_888[0],local_878[0] + 1);
  }
  if (local_8a8[0] != local_898) {
    operator_delete(local_8a8[0],local_898[0] + 1);
  }
  if (local_e28 != (code *)0x0) {
    (*local_e28)(&local_e38,&local_e38,3);
  }
  if (local_8c8[0] != local_8b8) {
    operator_delete(local_8c8[0],local_8b8[0] + 1);
  }
  if (local_8e8[0] != local_8d8) {
    operator_delete(local_8e8[0],local_8d8[0] + 1);
  }
  if (local_908[0] != local_8f8) {
    operator_delete(local_908[0],local_8f8[0] + 1);
  }
  if (local_928[0] != local_918) {
    operator_delete(local_928[0],local_918[0] + 1);
  }
  if (local_e48 != (code *)0x0) {
    (*local_e48)(&local_e58,&local_e58,3);
  }
  if (local_948[0] != local_938) {
    operator_delete(local_948[0],local_938[0] + 1);
  }
  if (local_968[0] != local_958) {
    operator_delete(local_968[0],local_958[0] + 1);
  }
  if (local_988[0] != local_978) {
    operator_delete(local_988[0],local_978[0] + 1);
  }
  if (local_9a8[0] != local_998) {
    operator_delete(local_9a8[0],local_998[0] + 1);
  }
  if (local_e68 != (code *)0x0) {
    (*local_e68)(&local_e78,&local_e78,3);
  }
  if (local_9c8[0] != local_9b8) {
    operator_delete(local_9c8[0],local_9b8[0] + 1);
  }
  if (local_9e8[0] != local_9d8) {
    operator_delete(local_9e8[0],local_9d8[0] + 1);
  }
  if (local_a08[0] != local_9f8) {
    operator_delete(local_a08[0],local_9f8[0] + 1);
  }
  if (local_a28[0] != local_a18) {
    operator_delete(local_a28[0],local_a18[0] + 1);
  }
  if (local_e88 != (code *)0x0) {
    (*local_e88)(&local_e98,&local_e98,3);
  }
  if (local_a48[0] != local_a38) {
    operator_delete(local_a48[0],local_a38[0] + 1);
  }
  if (local_a68[0] != local_a58) {
    operator_delete(local_a68[0],local_a58[0] + 1);
  }
  if (local_a88[0] != local_a78) {
    operator_delete(local_a88[0],local_a78[0] + 1);
  }
  if (local_aa8[0] != local_a98) {
    operator_delete(local_aa8[0],local_a98[0] + 1);
  }
  if (local_ea8 != (code *)0x0) {
    (*local_ea8)(&local_eb8,&local_eb8,3);
  }
  if (local_ac8[0] != local_ab8) {
    operator_delete(local_ac8[0],local_ab8[0] + 1);
  }
  if (local_ae8[0] != local_ad8) {
    operator_delete(local_ae8[0],local_ad8[0] + 1);
  }
  if (local_b08[0] != local_af8) {
    operator_delete(local_b08[0],local_af8[0] + 1);
  }
  if (local_b28[0] != local_b18) {
    operator_delete(local_b28[0],local_b18[0] + 1);
  }
  if (local_ec8 != (code *)0x0) {
    (*local_ec8)(&local_ed8,&local_ed8,3);
  }
  if (local_b48[0] != local_b38) {
    operator_delete(local_b48[0],local_b38[0] + 1);
  }
  if (local_b68[0] != local_b58) {
    operator_delete(local_b68[0],local_b58[0] + 1);
  }
  if (local_b88[0] != local_b78) {
    operator_delete(local_b88[0],local_b78[0] + 1);
  }
  if (local_ba8[0] != local_b98) {
    operator_delete(local_ba8[0],local_b98[0] + 1);
  }
  if (local_ee8 != (code *)0x0) {
    (*local_ee8)(&local_ef8,&local_ef8,3);
  }
  if (local_bc8[0] != local_bb8) {
    operator_delete(local_bc8[0],local_bb8[0] + 1);
  }
  if ((pointer)local_120._0_8_ != (pointer)(local_120 + 0x10)) {
    operator_delete((void *)local_120._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_120._16_8_)->_M_p + 1));
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],(ulong)(local_f0[0] + 1));
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,3);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_e0 != (undefined1  [8])local_d0) {
    operator_delete((void *)local_e0,local_d0._0_8_ + 1);
  }
  ::wasm::PassRegistry::get();
  ::wasm::PassRegistry::getRegisteredNames_abi_cxx11_();
  local_bd0 = (pointer)local_120._8_8_;
  if (local_120._0_8_ != local_120._8_8_) {
    pbVar7 = (pointer)local_120._0_8_;
    do {
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"--","");
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_b8,(ulong)(pbVar7->_M_dataplus)._M_p);
      local_58 = &local_48;
      psVar6 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar6) {
        local_48 = *psVar6;
        fStack_40 = *(float *)(plVar3 + 3);
        uStack_3c = *(undefined4 *)((long)plVar3 + 0x1c);
      }
      else {
        local_48 = *psVar6;
        local_58 = (size_type *)*plVar3;
      }
      local_50._M_nxt = (_Hash_node_base *)plVar3[1];
      *plVar3 = (long)psVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
      uVar4 = ::wasm::PassRegistry::get();
      local_228[0] = local_218;
      pcVar1 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_228,pcVar1,pcVar1 + pbVar7->_M_string_length);
      ::wasm::PassRegistry::getPassDescription(&local_148,uVar4,(string *)local_228);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Optimization passes","");
      local_e0 = (undefined1  [8])local_38;
      local_d8._M_p = local_d0 + 8;
      pcVar1 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,pcVar1,pcVar1 + pbVar7->_M_string_length);
      std::function<void(wasm::Options*,std::__cxx11::string_const&)>::
      function<wasm::OptimizationOptions::OptimizationOptions(std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(wasm::Options*,std::__cxx11::string_const&)_23_,void>
                ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)local_100,
                 (anon_class_40_2_fd512ddd *)local_e0);
      uVar4 = ::wasm::PassRegistry::get();
      local_208[0] = local_1f8;
      pcVar1 = (pbVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_208,pcVar1,pcVar1 + pbVar7->_M_string_length);
      ::wasm::PassRegistry::isPassHidden(uVar4,(string *)local_208);
      ::wasm::Options::add
                ((string *)local_38,(string *)&local_58,(string *)local_98,(string *)&local_148,
                 (Arguments)local_78,(function *)0x3,false);
      if (local_208[0] != local_1f8) {
        operator_delete(local_208[0],local_1f8[0] + 1);
      }
      if (local_f0[0] != (code *)0x0) {
        (*local_f0[0])(local_100,local_100,3);
      }
      if (local_d8._M_p != local_d0 + 8) {
        operator_delete(local_d8._M_p,local_d0._8_8_ + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      if (local_148 != (OptimizationOptions *)&local_138) {
        operator_delete(local_148,(ulong)(local_138 + 1));
      }
      if (local_228[0] != local_218) {
        operator_delete(local_228[0],local_218[0] + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_bd0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  return;
}

Assistant:

OptimizationOptions(const std::string& command,
                      const std::string& description)
    : ToolOptions(command, description) {
    (*this)
      .add(
        "",
        "-O",
        "execute default optimization passes (equivalent to -Os)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.setDefaultOptimizationOptions();
          static_assert(
            PassOptions::DEFAULT_OPTIMIZE_LEVEL == OS_OPTIMIZE_LEVEL &&
              PassOptions::DEFAULT_SHRINK_LEVEL == OS_SHRINK_LEVEL,
            "Help text states that -O is equivalent to -Os but now it isn't.");
          addDefaultOptPasses();
        })
      .add("",
           "-O0",
           "execute no optimization passes",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 0;
             passOptions.shrinkLevel = 0;
           })
      .add("",
           "-O1",
           "execute -O1 optimization passes (quick&useful opts, useful for "
           "iteration builds)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 1;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add(
        "",
        "-O2",
        "execute -O2 optimization passes (most opts, generally gets most perf)",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.optimizeLevel = 2;
          passOptions.shrinkLevel = 0;
          addDefaultOptPasses();
        })
      .add("",
           "-O3",
           "execute -O3 optimization passes (spends potentially a lot of time "
           "optimizing)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 3;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-O4",
           "execute -O4 optimization passes (also flatten the IR, which can "
           "take a lot more time and memory, but is useful on more nested / "
           "complex / less-optimized input)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 4;
             passOptions.shrinkLevel = 0;
             addDefaultOptPasses();
           })
      .add("",
           "-Os",
           "execute default optimization passes, focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = OS_OPTIMIZE_LEVEL;
             passOptions.shrinkLevel = OS_SHRINK_LEVEL;
             addDefaultOptPasses();
           })
      .add("",
           "-Oz",
           "execute default optimization passes, super-focusing on code size",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.optimizeLevel = 2;
             passOptions.shrinkLevel = 2;
             addDefaultOptPasses();
           })
      .add("--optimize-level",
           "-ol",
           "How much to focus on optimizing code",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.optimizeLevel = atoi(argument.c_str());
           })
      .add("--shrink-level",
           "-s",
           "How much to focus on shrinking code size",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.shrinkLevel = atoi(argument.c_str());
           })
      .add("--debuginfo",
           "-g",
           "Emit names section in wasm binary (or full debuginfo in wast)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             passOptions.debugInfo = true;
           })
      .add("--always-inline-max-function-size",
           "-aimfs",
           "Max size of functions that are always inlined (default " +
             std::to_string(InliningOptions().alwaysInlineMaxSize) +
             ", which "
             "is safe for use with -Os builds)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.alwaysInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--flexible-inline-max-function-size",
           "-fimfs",
           "Max size of functions that are inlined when lightweight (no loops "
           "or function calls) when optimizing aggressively for speed (-O3). "
           "Default: " +
             std::to_string(InliningOptions().flexibleInlineMaxSize),
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.flexibleInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--one-caller-inline-max-function-size",
           "-ocimfs",
           "Max size of functions that are inlined when there is only one "
           "caller (default -1, which means all such functions are inlined)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             static_assert(InliningOptions().oneCallerInlineMaxSize ==
                             Index(-1),
                           "the help text here is written to assume -1");
             passOptions.inlining.oneCallerInlineMaxSize =
               static_cast<Index>(atoi(argument.c_str()));
           })
      .add("--inline-functions-with-loops",
           "-ifwl",
           "Allow inlining functions with loops",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string&) {
             passOptions.inlining.allowFunctionsWithLoops = true;
           })
      .add("--partial-inlining-ifs",
           "-pii",
           "Number of ifs allowed in partial inlining (zero means partial "
           "inlining is disabled) (default: " +
             std::to_string(InliningOptions().partialInliningIfs) + ')',
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options* o, const std::string& argument) {
             passOptions.inlining.partialInliningIfs =
               static_cast<Index>(std::stoi(argument));
           })
      .add("--ignore-implicit-traps",
           "-iit",
           "Optimize under the helpful assumption that no surprising traps "
           "occur (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.ignoreImplicitTraps = true;
           })
      .add("--traps-never-happen",
           "-tnh",
           "Optimize under the helpful assumption that no trap is reached at "
           "runtime (from load, div/mod, etc.)",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.trapsNeverHappen = true;
           })
      .add("--low-memory-unused",
           "-lmu",
           "Optimize under the helpful assumption that the low 1K of memory is "
           "not used by the application",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.lowMemoryUnused = true;
           })
      .add(
        "--fast-math",
        "-ffm",
        "Optimize floats without handling corner cases of NaNs and rounding",
        OptimizationOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) { passOptions.fastMath = true; })
      .add("--zero-filled-memory",
           "-uim",
           "Assume that an imported memory will be zero-initialized",
           OptimizationOptionsCategory,
           Options::Arguments::Zero,
           [this](Options*, const std::string&) {
             passOptions.zeroFilledMemory = true;
           })
      .add("--skip-pass",
           "-sp",
           "Skip a pass (do not run it)",
           OptimizationOptionsCategory,
           Options::Arguments::One,
           [this](Options*, const std::string& pass) {
             passOptions.passesToSkip.insert(pass);
           });

    // add passes in registry
    for (const auto& p : PassRegistry::get()->getRegisteredNames()) {
      (*this).add(
        std::string("--") + p,
        "",
        PassRegistry::get()->getPassDescription(p),
        "Optimization passes",
        // Allow an optional parameter to a pass. If provided, it is
        // the same as if using --pass-arg, that is,
        //
        //   --foo=ARG
        //
        // is the same as
        //
        //   --foo --pass-arg=foo@ARG
        Options::Arguments::Optional,
        [this, p](Options*, const std::string& arg) {
          if (!arg.empty()) {
            if (passOptions.arguments.count(p)) {
              Fatal() << "Cannot pass multiple pass arguments to " << p;
            }
            passOptions.arguments[p] = arg;
          }
          passes.push_back(p);
        },
        PassRegistry::get()->isPassHidden(p));
    }
  }